

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_alps_add_clienthello_impl
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type,
               bool use_new_codepoint)

{
  SSL_CONFIG *pSVar1;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  uint16_t value;
  ALPSConfig *pAVar5;
  ALPSConfig *config;
  ALPSConfig *pAVar6;
  bool bVar7;
  CBB proto_list;
  CBB contents;
  CBB proto;
  CBB CStack_b8;
  CBB local_88;
  CBB local_58;
  
  bVar7 = true;
  if (0x303 < hs->max_version) {
    pSVar1 = hs->config;
    if (((((pSVar1->alpn_client_proto_list).size_ != 0) && ((pSVar1->alps_configs).size_ != 0)) &&
        ((hs->ssl->s3->field_0xdc & 0x10) == 0)) &&
       (uVar4 = *(ushort *)&pSVar1->field_0x10d & 0x2000,
       (ushort)(uVar4 >> 0xd) == ((ushort)out_compressible & 0xff))) {
      value = 0x44cd;
      if ((short)uVar4 == 0) {
        value = 0x4469;
      }
      iVar3 = CBB_add_u16(out,value);
      if (((iVar3 == 0) || (iVar3 = CBB_add_u16_length_prefixed(out,&local_88), iVar3 == 0)) ||
         (iVar3 = CBB_add_u16_length_prefixed(&local_88,&CStack_b8), iVar3 == 0)) {
LAB_0013e829:
        bVar7 = false;
      }
      else {
        sVar2 = (hs->config->alps_configs).size_;
        if (sVar2 != 0) {
          pAVar6 = (hs->config->alps_configs).data_;
          pAVar5 = pAVar6 + sVar2;
          do {
            iVar3 = CBB_add_u8_length_prefixed(&CStack_b8,&local_58);
            if ((iVar3 == 0) ||
               (iVar3 = CBB_add_bytes(&local_58,(pAVar6->protocol).data_,(pAVar6->protocol).size_),
               iVar3 == 0)) goto LAB_0013e829;
            pAVar6 = pAVar6 + 1;
          } while (pAVar6 != pAVar5);
        }
        iVar3 = CBB_flush(out);
        bVar7 = iVar3 != 0;
      }
    }
  }
  return bVar7;
}

Assistant:

static bool ext_alps_add_clienthello_impl(const SSL_HANDSHAKE *hs, CBB *out,
                                          CBB *out_compressible,
                                          ssl_client_hello_type_t type,
                                          bool use_new_codepoint) {
  const SSL *const ssl = hs->ssl;
  if (  // ALPS requires TLS 1.3.
      hs->max_version < TLS1_3_VERSION ||
      // Do not offer ALPS without ALPN.
      hs->config->alpn_client_proto_list.empty() ||
      // Do not offer ALPS if not configured.
      hs->config->alps_configs.empty() ||
      // Do not offer ALPS on renegotiation handshakes.
      ssl->s3->initial_handshake_complete) {
    return true;
  }

  if (use_new_codepoint != hs->config->alps_use_new_codepoint) {
    // Do nothing, we'll send the other codepoint.
    return true;
  }

  uint16_t extension_type = TLSEXT_TYPE_application_settings_old;
  if (hs->config->alps_use_new_codepoint) {
    extension_type = TLSEXT_TYPE_application_settings;
  }

  CBB contents, proto_list, proto;
  if (!CBB_add_u16(out_compressible, extension_type) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &proto_list)) {
    return false;
  }

  for (const ALPSConfig &config : hs->config->alps_configs) {
    if (!CBB_add_u8_length_prefixed(&proto_list, &proto) ||
        !CBB_add_bytes(&proto, config.protocol.data(),
                       config.protocol.size())) {
      return false;
    }
  }

  return CBB_flush(out_compressible);
}